

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::
msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset
          (msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          )

{
  uint uVar1;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  basic_item_event_receiver<char> *in_stack_00000030;
  
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset(in_RDI)
  ;
  basic_item_event_receiver<char>::reset(in_stack_00000030);
  in_RDI[1].source_.null_is_.super_basic_istream<char,_std::char_traits<char>_>.field_0x50 = 0;
  uVar1 = (*(in_RDI->super_ser_context)._vptr_ser_context[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_ser_context)._vptr_ser_context[7])();
  }
  return;
}

Assistant:

void reset()
        {
            parser_.reset();
            cursor_visitor_.reset();
            eof_ = false;
            if (!done())
            {
                next();
            }
        }